

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttp2connection_p.h
# Opt level: O2

bool __thiscall QHttp2Stream::isUploadBlocked(QHttp2Stream *this)

{
  bool bVar1;
  QHttp2Connection *pQVar2;
  
  if (*(long *)(this + 0x38) != 0) {
    bVar1 = true;
    if (10 < *(int *)(this + 0x18)) {
      pQVar2 = getConnection(this);
      bVar1 = pQVar2->sessionSendWindowSize < 0xb;
    }
    return bVar1;
  }
  return false;
}

Assistant:

bool isUploadingDATA() const noexcept { return m_uploadByteDevice != nullptr; }